

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

int __thiscall Player::reinforce(Player *this)

{
  CardType CVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  pointer pCVar3;
  Hand *hand;
  Deck *deck;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *pvVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  Country *pCVar6;
  pointer ppCVar7;
  bool bVar8;
  int numCavalry;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  pointer pCVar12;
  GameLoop *pGVar13;
  int numArtillery;
  uint uVar14;
  char *pcVar15;
  pointer ppCVar16;
  pointer ppCVar17;
  int numInfantry;
  int iVar18;
  Player *this_00;
  uint uVar19;
  const_iterator __begin1;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  CardType local_84;
  Player *local_80;
  int local_74 [3];
  string local_68;
  _Vector_base<CardType,_std::allocator<CardType>_> local_48;
  
  setPlayerState(this,REINFORCING);
  notifyAll(this);
  PlayerStrategy::getStrategyName_abi_cxx11_(&local_68,this->strategy);
  bVar8 = std::operator==(&local_68,"CHEATER");
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar8) {
    iVar9 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,10);
    iVar9 = (int)(char)iVar9;
  }
  else {
    iVar9 = 0;
    local_80 = this;
    while( true ) {
      this_00 = local_80;
      pvVar2 = local_80->pCards->handPointer;
      pCVar12 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar3 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)((long)pCVar3 - (long)pCVar12) < 0x15) break;
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "You have more than 5 cards in your hand, so you must exchange at least once"
                               );
      std::endl<char,std::char_traits<char>>(poVar11);
LAB_00114bcb:
      poVar11 = std::operator<<((ostream *)&std::cout,"What cards would you like to exchange?");
      std::endl<char,std::char_traits<char>>(poVar11);
      pvVar2 = this_00->pCards->handPointer;
      iVar20 = 0;
      iVar23 = 0;
      iVar22 = 0;
      for (pCVar12 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          pCVar12 !=
          (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
          super__Vector_impl_data._M_finish; pCVar12 = pCVar12 + 1) {
        CVar1 = *pCVar12;
        if (CVar1 == INFANTRY) {
          iVar20 = iVar20 + 1;
        }
        else if (CVar1 == ARTILLERY) {
          iVar23 = iVar23 + 1;
        }
        else {
          if (CVar1 != CAVALRY) goto LAB_00114f99;
          iVar22 = iVar22 + 1;
        }
      }
      local_74[0] = iVar20;
      local_74[1] = iVar23;
      local_74[2] = iVar22;
      poVar11 = std::operator<<((ostream *)&std::cout,"You hand is: ");
      std::endl<char,std::char_traits<char>>(poVar11);
      poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar20);
      std::operator<<(poVar11," infantry, ");
      poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar23);
      std::operator<<(poVar11," artillery, and ");
      poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar22);
      poVar11 = std::operator<<(poVar11," cavalry");
      std::endl<char,std::char_traits<char>>(poVar11);
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      iVar20 = 3;
      do {
        if (iVar20 < 1) {
          hand = this_00->pCards;
          pGVar13 = GameLoop::getInstance();
          deck = pGVar13->gameDeck;
          std::vector<CardType,_std::allocator<CardType>_>::vector
                    ((vector<CardType,_std::allocator<CardType>_> *)&local_48,
                     (vector<CardType,_std::allocator<CardType>_> *)&local_68);
          iVar20 = Hand::exchange(hand,deck,(vector<CardType,_std::allocator<CardType>_> *)&local_48
                                 );
          std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base(&local_48);
          if (iVar20 != -1) {
            iVar9 = iVar9 + iVar20;
            bVar8 = true;
            goto LAB_00114eea;
          }
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "An error occurred while exchanging your cards.");
          std::endl<char,std::char_traits<char>>(poVar11);
          break;
        }
        poVar11 = std::operator<<((ostream *)&std::cout,"You must pick ");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar20);
        poVar11 = std::operator<<(poVar11," more cards to exchange");
        std::endl<char,std::char_traits<char>>(poVar11);
        for (uVar21 = 0; uVar21 != 3; uVar21 = uVar21 + 1) {
          iVar22 = local_74[uVar21];
          if (0 < iVar22) {
            pcVar15 = "cavalry";
            if (uVar21 == 1) {
              pcVar15 = "artillery";
            }
            if (uVar21 == 0) {
              pcVar15 = "infantry";
            }
            iVar23 = 0;
            do {
              while( true ) {
                if (iVar23 == 10) {
                  poVar11 = std::operator<<((ostream *)&std::cout,
                                            "An error occurred while exchanging your cards.");
                  std::endl<char,std::char_traits<char>>(poVar11);
                  goto LAB_00114e52;
                }
                poVar11 = std::operator<<((ostream *)&std::cout,"How many ");
                std::operator<<(poVar11,pcVar15);
                std::operator<<((ostream *)&std::cout," would you like to exchange?");
                (*this_00->strategy->_vptr_PlayerStrategy[3])(this_00->strategy,uVar21 & 0xffffffff)
                ;
                iVar10 = (*this_00->strategy->_vptr_PlayerStrategy[1])(this_00->strategy,0xb);
                if (iVar20 < iVar10) {
                  poVar11 = std::operator<<((ostream *)&std::cout,"You can only exchange ");
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar20);
                  poVar11 = std::operator<<(poVar11," more cards");
                  std::endl<char,std::char_traits<char>>(poVar11);
                }
                else if (iVar22 < iVar10) {
                  std::operator<<((ostream *)&std::cout,
                                  "You cannot exchange more cards of a given type than you have in your hand."
                                 );
                }
                else {
                  iVar18 = 0;
                  if (0 < iVar10) {
                    iVar18 = iVar10;
                  }
                  iVar20 = iVar20 - iVar18;
                  while (bVar8 = iVar18 != 0, iVar18 = iVar18 + -1, this_00 = local_80, bVar8) {
                    local_84 = (CardType)uVar21;
                    std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
                              ((vector<CardType,_std::allocator<CardType>_> *)&local_68,&local_84);
                  }
                }
                iVar23 = iVar23 + 1;
                if (iVar22 < iVar10) break;
                if ((iVar10 <= iVar20) || (iVar20 == 0)) goto LAB_00114e33;
              }
            } while (iVar20 != 0);
            iVar20 = 0;
          }
LAB_00114e33:
        }
LAB_00114e52:
      } while (uVar21 == 3);
      bVar8 = false;
LAB_00114eea:
      std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base
                ((_Vector_base<CardType,_std::allocator<CardType>_> *)&local_68);
      this_00 = local_80;
      if (!bVar8) goto LAB_00114f99;
    }
    iVar20 = 0;
    iVar22 = 0;
    iVar23 = 0;
    for (; pCVar12 != pCVar3; pCVar12 = pCVar12 + 1) {
      CVar1 = *pCVar12;
      if (CVar1 == CAVALRY) {
        iVar20 = iVar20 + 1;
      }
      else if (CVar1 == ARTILLERY) {
        iVar22 = iVar22 + 1;
      }
      else if (CVar1 == INFANTRY) {
        iVar23 = iVar23 + 1;
      }
    }
    if ((iVar23 < 3 && (iVar20 < 3 && iVar22 < 3)) &&
       (((iVar23 < 1 || (iVar22 < 1)) || (iVar20 < 1)))) {
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "You don\'t have valid cards to exchange! Moving on...");
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    else {
      while( true ) {
        std::operator<<((ostream *)&std::cout,"Would you like to exchange cards? (Y/n)");
        uVar19 = (**this_00->strategy->_vptr_PlayerStrategy)(this_00->strategy,10);
        uVar14 = (uVar19 & 0xff) - 0x4e;
        if ((uVar14 < 0x2c) && ((0x80100000801U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) break;
        poVar11 = std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      if (((byte)uVar19 & 0x5f) != 0x4e) goto LAB_00114bcb;
    }
    if (-1 < iVar9) {
      uVar21 = (long)(this_00->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_00->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      iVar20 = (int)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) / 3);
      if (uVar21 < 9) {
        iVar20 = 3;
      }
      pGVar13 = GameLoop::getInstance();
      pvVar4 = pGVar13->gameMap->pMapContinents;
      ppCVar16 = (pvVar4->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      iVar22 = 0;
      do {
        if (ppCVar16 ==
            (pvVar4->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          uVar19 = iVar20 + iVar9 + iVar22;
          (*this_00->strategy->_vptr_PlayerStrategy[2])(this_00->strategy,(ulong)uVar19);
          pcVar15 = "Place your armies:";
LAB_00114fe9:
          poVar11 = std::operator<<((ostream *)&std::cout,pcVar15);
          std::endl<char,std::char_traits<char>>(poVar11);
          uVar14 = uVar19;
          do {
            if ((int)uVar14 < 1) {
              setPlayerState(this_00,IDLE);
              (*this_00->strategy->_vptr_PlayerStrategy[5])();
              return 1;
            }
            poVar11 = std::operator<<((ostream *)&std::cout,"Troops remaining: ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar14);
            std::endl<char,std::char_traits<char>>(poVar11);
            ppCVar17 = (this_00->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            ppCVar7 = (this_00->pOwnedCountries->
                      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            while (ppCVar17 != ppCVar7) {
              pCVar6 = *ppCVar17;
              Map::Country::getCountryName_abi_cxx11_(&local_68,pCVar6);
              poVar11 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
              poVar11 = std::operator<<(poVar11," has ");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pCVar6->pNumberOfTroops);
              std::operator<<(poVar11," armies. Add how many? ");
              std::__cxx11::string::~string((string *)&local_68);
              do {
                (*this_00->strategy->_vptr_PlayerStrategy[4])(this_00->strategy,pCVar6);
                (*this_00->strategy->_vptr_PlayerStrategy[2])(this_00->strategy,(ulong)uVar14);
                iVar9 = (*this_00->strategy->_vptr_PlayerStrategy[1])(this_00->strategy,0xc);
                uVar19 = *(uint *)(std::__cxx11::wstring::resize + *(long *)(std::cin + -0x18));
                if (((uVar19 & 5) != 0) || ((int)uVar14 < iVar9 || iVar9 < 0)) {
                  poVar11 = std::operator<<((ostream *)&std::cout,
                                            "Invalid value entered. Pleased try again.");
                  std::endl<char,std::char_traits<char>>(poVar11);
                  uVar19 = *(uint *)(std::__cxx11::wstring::resize + *(long *)(std::cin + -0x18));
                }
              } while (((uVar19 & 5) != 0) || (iVar9 < 0 || (int)uVar14 < iVar9));
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              *pCVar6->pNumberOfTroops = *pCVar6->pNumberOfTroops + iVar9;
              ppCVar17 = ppCVar17 + 1;
              uVar19 = uVar14 - iVar9;
              bVar8 = (int)uVar14 < iVar9;
              uVar14 = uVar19;
              if (uVar19 == 0 || bVar8) {
                pcVar15 = "\nYou\'ve placed all your armies!";
                goto LAB_00114fe9;
              }
            }
          } while( true );
        }
        pvVar5 = (*ppCVar16)->pCountriesInContinent;
        ppCVar17 = (pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        do {
          if (ppCVar17 ==
              (pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar22 = iVar22 + *(*ppCVar16)->pCTroops;
            break;
          }
          pCVar6 = *ppCVar17;
          ppCVar17 = ppCVar17 + 1;
        } while (*this_00->pPlayerId == *pCVar6->pPlayerOwnerId);
        ppCVar16 = ppCVar16 + 1;
      } while( true );
    }
LAB_00114f99:
    setPlayerState(this_00,IDLE);
    (*this_00->strategy->_vptr_PlayerStrategy[5])();
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int Player::reinforce() {
    /* Act of collecting new armies and placing them on the map
     * 0. At the start of your turn, if you have 5+ cards, player must trade at least 1 set.
     * 1. Trade valid sets of cards to receive armies
     * 2. Place received armies on the map
     */
    auto cardExchange = [](Player &player) {
        auto output = 0;

        while (true) {
            if (player.getCards()->getHand()->size() > 5) {
                std::cout << "You have more than 5 cards in your hand, so you must exchange at least once" << std::endl;
            } else if (canExchange(*player.getCards()->getHand())) {
                char input = 0;
                do {
                    std::cout << "Would you like to exchange cards? (Y/n)";
                    input = player.strategy->yesOrNo(StrategyContext::REINFORCE);
                    if (input != 'y' && input != 'n' && input != 'Y' && input != 'N') {
                        std::cout << "\nInvalid Input. Please try again." << std::endl;
                    }
                } while (input != 'y' && input != 'n' && input != 'Y' && input != 'N');
                if (input == 'n' || input == 'N') {
                    return output;
                }
            } else {
                std::cout << "You don't have valid cards to exchange! Moving on..." << std::endl;
                return output;
            }
            std::cout << "What cards would you like to exchange?" << std::endl;
            int types[3] = {};
            types[0] = 0, types[1] = 0, types[2] = 0;
            for (auto card : *player.getCards()->getHand()) {
                switch (card) {
                    case CardType::INFANTRY:
                        types[0]++;
                        break;
                    case CardType::ARTILLERY:
                        types[1]++;
                        break;
                    case CardType::CAVALRY:
                        types[2]++;
                        break;
                    default: {
                        return -1;
                    }
                }
            }

            std::cout << "You hand is: " << std::endl;
            std::cout << types[0] << " infantry, ";
            std::cout << types[1] << " artillery, and ";
            std::cout << types[2] << " cavalry" << std::endl;

            auto cardsToExchange = std::vector<CardType>();
            auto remaining = 3;

            while (remaining > 0) {
                std::cout << "You must pick " << remaining << " more cards to exchange" << std::endl;
                for (auto i = 0; i <= 2; i++) {
                    if (types[i] > 0) {
                        auto input = 0;
                        int failsafeCounter = 0;
                        do {
                            //avoid infinite loops in case of bot malfunction or human delaying the game
                            if(failsafeCounter >= 10){
                                std::cout << "An error occurred while exchanging your cards." << std::endl;
                                return -1;
                            }
                            failsafeCounter++;
                            std::cout << "How many " << (i == 0 ? "infantry" : i == 1 ? "artillery" : "cavalry");
                            std::cout << " would you like to exchange?";
                            player.strategy->setExchangingCardType(i);
                            input = player.strategy->intInput(StrategyContext::REINFORCE_CARD_COUNT);
                            if (input > remaining) {
                                std::cout << "You can only exchange " << remaining << " more cards" << std::endl;
                            } else if (input > types[i]) {
                                std::cout
                                        << "You cannot exchange more cards of a given type than you have in your hand.";
                            } else {
                                for (auto j = 0; j < input; j++, remaining--) {
                                    cardsToExchange.push_back((CardType) i);
                                }

                            }
                        } while ((input > types[i] || input > remaining) && remaining != 0);
                    }
                }
            }
            auto out = Hand::exchange(player.getCards(), GameLoop::getInstance()->getGameDeck(), cardsToExchange);
            if (out == -1) {
                std::cout << "An error occurred while exchanging your cards." << std::endl;
                return -1;
            } else {
                output += out;
            }
        }
    };

    auto countriesOwned = [](Player& player) {
        auto countries = player.getOwnedCountries()->size();

        return countries < 9 ? 3 : (int) countries / 3;
    };

    auto continentControlValue = [](const Player &player) {
        auto value = 0;
        for (auto *cont : *GameLoop::getInstance()->getGameMap()->getMapContinents()) {
            auto fullControl = true;

            for (auto *country : *cont->getCountriesInContinent()) {
                if (player.getPlayerId() != country->getPlayerOwnerID()) {
                    fullControl = false;
                    break;
                }
            }

            if (fullControl) {
                value += cont->getpCTroops();
            }
        }

        return value;
    };

    this->setPlayerState(PlayerState::REINFORCING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::REINFORCE);
    }

    auto exchange = cardExchange(*this);
    if (exchange < 0) {
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::FAILED;
    }

    auto newArmies = exchange + countriesOwned(*this) + continentControlValue(*this);
    strategy->setArmiesToPlace(newArmies);

    std::cout << "Place your armies:" << std::endl;

    int troops, place = 0;
    while (newArmies > 0) {
        std::cout << "Troops remaining: " << newArmies << std::endl;
        for (auto *country : *this->getOwnedCountries()) {
            std::cout << country->getCountryName() << " has " << country->getNumberOfTroops() << " armies. Add how many? ";
            do {
                strategy->setTo(country);
                strategy->setArmiesToPlace(newArmies);
                place = strategy->intInput(StrategyContext::REINFORCE_ARMY_COUNT);
                if(cin.fail() || place > newArmies || place < 0 || isnan(place)) {
                    std::cout << "Invalid value entered. Pleased try again." << std::endl;
                }
            } while (cin.fail() || place > newArmies || place < 0 || isnan(place));
            std::cout << std::endl;
            troops = country->getNumberOfTroops();
            country->setNumberOfTroops(troops + place);
            newArmies -= place;
            if (newArmies <= 0) {
                std::cout << "\nYou've placed all your armies!" << std::endl;
                break;
            }
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    this->strategy->resetChoices();
    return PlayerAction::SUCCEEDED;
}